

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonStringReset(JsonString *p)

{
  if (p->bStatic == '\0') {
    sqlite3RCStrUnref(p->zBuf);
  }
  p->zBuf = p->zSpace;
  p->nAlloc = 100;
  p->nUsed = 0;
  p->bStatic = '\x01';
  return;
}

Assistant:

static void jsonStringReset(JsonString *p){
  if( !p->bStatic ) sqlite3RCStrUnref(p->zBuf);
  jsonStringZero(p);
}